

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O3

void BrotliCreateHqZopfliBackwardReferences
               (MemoryManager *m,size_t num_bytes,size_t position,uint8_t *ringbuffer,
               size_t ringbuffer_mask,BrotliEncoderParams *params,HasherHandle hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  float *pfVar1;
  undefined4 *puVar2;
  float fVar3;
  ushort uVar4;
  ushort uVar5;
  size_t sVar6;
  size_t sVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  bool bVar10;
  float *pfVar11;
  undefined4 uVar12;
  int iVar13;
  uint uVar14;
  void *__dest;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  StartPosQueue *queue;
  size_t sVar18;
  size_t sVar19;
  uint uVar20;
  ulong uVar21;
  size_t sVar22;
  ulong uVar23;
  uint8_t *puVar24;
  ulong max_backward_limit;
  undefined4 *puVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  long lVar33;
  uint8_t *puVar34;
  long lVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  long lVar39;
  long lVar40;
  bool bVar41;
  bool bVar42;
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar46;
  float fVar47;
  undefined1 auVar48 [16];
  ZopfliNode *nodes;
  ulong local_27f0;
  ulong local_27e0;
  ulong local_27c8;
  ulong local_27c0;
  ulong local_2798;
  void *local_2790;
  void *local_2780;
  ulong local_2758;
  long local_2750;
  long local_2740;
  int orig_dist_cache [4];
  ZopfliCostModel model;
  uint32_t histogram_cmd [704];
  uint32_t histogram_literal [256];
  float cost_literal [256];
  uint32_t histogram_dist [544];
  
  max_backward_limit = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  if (num_bytes == 0) {
    bVar41 = false;
    local_2780 = (void *)0x0;
    local_2790 = (void *)0x0;
  }
  else {
    local_2758 = num_bytes * 4;
    local_2780 = BrotliAllocate(m,local_2758);
    local_2790 = (void *)0x0;
    lVar39 = num_bytes - 0x7f;
    if (num_bytes < 0x7f) {
      lVar39 = 0;
    }
    if (local_2758 != 0) {
      local_2790 = BrotliAllocate(m,num_bytes << 5);
    }
    bVar41 = 3 < num_bytes;
    if (bVar41) {
      lVar40 = 0;
      lVar35 = 0;
      auVar48 = _DAT_00132090;
      do {
        uVar36 = position + lVar40;
        uVar23 = max_backward_limit;
        if (uVar36 < max_backward_limit) {
          uVar23 = uVar36;
        }
        uVar15 = lVar35 + 0x80;
        if (local_2758 < uVar15) {
          uVar16 = local_2758;
          if (local_2758 == 0) {
            uVar16 = uVar15;
          }
          do {
            uVar37 = uVar16;
            uVar16 = uVar37 * 2;
          } while (uVar37 < uVar15);
          __dest = BrotliAllocate(m,uVar37 * 8);
          if (local_2758 != 0) {
            memcpy(__dest,local_2790,local_2758 << 3);
          }
          BrotliFree(m,local_2790);
          local_2790 = __dest;
          auVar48 = _DAT_00132090;
          local_2758 = uVar37;
        }
        uVar37 = num_bytes - lVar40;
        puVar2 = (undefined4 *)((long)local_2790 + lVar35 * 8);
        uVar15 = uVar36 & ringbuffer_mask;
        uVar16 = 0x10;
        if (params->quality == 0xb) {
          uVar16 = 0x40;
        }
        uVar30 = 0;
        if (uVar16 <= uVar36) {
          uVar30 = uVar36 - uVar16;
        }
        uVar16 = uVar36 - 1;
        uVar21 = 1;
        puVar25 = puVar2;
        if (uVar30 < uVar16) {
          puVar24 = ringbuffer + uVar15;
          uVar31 = (ulong)((uint)uVar37 & 7);
          uVar21 = 1;
          while (uVar36 - uVar16 <= uVar23) {
            uVar32 = uVar16 & ringbuffer_mask;
            if ((*puVar24 == ringbuffer[uVar32]) && (puVar24[1] == ringbuffer[uVar32 + 1])) {
              if (7 < uVar37) {
                lVar33 = 0;
                uVar27 = 0;
LAB_0010d2a4:
                if (*(ulong *)(puVar24 + uVar27 * 8) == *(ulong *)(ringbuffer + uVar27 * 8 + uVar32)
                   ) goto code_r0x0010d2b1;
                uVar27 = *(ulong *)(ringbuffer + uVar27 * 8 + uVar32) ^
                         *(ulong *)(puVar24 + uVar27 * 8);
                uVar32 = 0;
                if (uVar27 != 0) {
                  for (; (uVar27 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                  }
                }
                uVar27 = (uVar32 >> 3 & 0x1fffffff) - lVar33;
                goto LAB_0010d2df;
              }
              puVar34 = puVar24;
              uVar38 = 0;
LAB_0010d31d:
              uVar27 = uVar38;
              if (uVar31 != 0) {
                uVar28 = uVar31 | uVar38;
                uVar29 = uVar31;
                do {
                  uVar27 = uVar38;
                  if (ringbuffer[uVar38 + uVar32] != *puVar34) break;
                  puVar34 = puVar34 + 1;
                  uVar38 = uVar38 + 1;
                  uVar29 = uVar29 - 1;
                  uVar27 = uVar28;
                } while (uVar29 != 0);
              }
LAB_0010d2df:
              if (uVar21 < uVar27) {
                *puVar25 = (int)(uVar36 - uVar16);
                puVar25[1] = (int)uVar27 << 5;
                puVar25 = puVar25 + 2;
                uVar21 = uVar27;
              }
            }
            uVar16 = uVar16 - 1;
            if ((uVar16 <= uVar30) || (2 < uVar21)) break;
          }
        }
        if (uVar21 < uVar37) {
          uVar30 = (ulong)((uint)(*(int *)(ringbuffer + uVar15) * 0x1e35a7bd) >> 0xf);
          uVar31 = (ulong)*(uint *)(hasher + uVar30 * 4 + 0x30);
          uVar16 = uVar37;
          if (0x7f < uVar37) {
            *(int *)(hasher + uVar30 * 4 + 0x30) = (int)uVar36;
            uVar16 = 0x80;
          }
          uVar30 = *(ulong *)(hasher + 0x28);
          local_2740 = (uVar30 & uVar36) * 2 + 1;
          local_2750 = (uVar30 & uVar36) * 2;
          if (uVar36 != uVar31) {
            lVar33 = 0x40;
            local_2798 = 0;
            local_27c0 = 0;
LAB_0010d402:
            bVar42 = lVar33 != 0;
            lVar33 = lVar33 + -1;
            if ((uVar36 - uVar31 <= uVar23) && (bVar42)) {
              uVar32 = local_2798;
              if (local_27c0 < local_2798) {
                uVar32 = local_27c0;
              }
              puVar24 = ringbuffer + uVar32 + (uVar31 & ringbuffer_mask);
              uVar27 = uVar37 - uVar32;
              if (7 < uVar27) {
                uVar38 = uVar27 & 0xfffffffffffffff8;
                lVar26 = 0;
                uVar29 = 0;
LAB_0010d474:
                if (*(ulong *)(puVar24 + uVar29 * 8) ==
                    *(ulong *)(ringbuffer + uVar29 * 8 + uVar32 + uVar15)) goto code_r0x0010d481;
                uVar38 = *(ulong *)(ringbuffer + uVar29 * 8 + uVar32 + uVar15) ^
                         *(ulong *)(puVar24 + uVar29 * 8);
                uVar27 = 0;
                if (uVar38 != 0) {
                  for (; (uVar38 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                  }
                }
                uVar29 = (uVar27 >> 3 & 0x1fffffff) - lVar26;
                goto LAB_0010d4bc;
              }
              uVar38 = 0;
              goto LAB_0010d5a8;
            }
          }
LAB_0010d5dd:
          if (0x7f < uVar37) {
            uVar12 = *(undefined4 *)(hasher + 0x80030);
            *(undefined4 *)(hasher + local_2750 * 4 + 0x80038) = uVar12;
LAB_0010d5fb:
            *(undefined4 *)(hasher + local_2740 * 4 + 0x80038) = uVar12;
          }
        }
LAB_0010d642:
        lVar33 = 3;
        auVar44 = _DAT_00132080;
        auVar45 = _DAT_00132070;
        do {
          if (SUB164(auVar44 ^ auVar48,4) == -0x80000000 &&
              SUB164(auVar44 ^ auVar48,0) < -0x7fffffda) {
            histogram_cmd[lVar33 + -3] = 0xfffffff;
            histogram_cmd[lVar33 + -2] = 0xfffffff;
          }
          if (SUB164(auVar45 ^ auVar48,4) == -0x80000000 &&
              SUB164(auVar45 ^ auVar48,0) < -0x7fffffda) {
            histogram_cmd[lVar33 + -1] = 0xfffffff;
            histogram_cmd[lVar33] = 0xfffffff;
          }
          lVar26 = auVar44._8_8_;
          auVar44._0_8_ = auVar44._0_8_ + 4;
          auVar44._8_8_ = lVar26 + 4;
          lVar26 = auVar45._8_8_;
          auVar45._0_8_ = auVar45._0_8_ + 4;
          auVar45._8_8_ = lVar26 + 4;
          lVar33 = lVar33 + 4;
        } while (lVar33 != 0x2b);
        sVar22 = uVar21 + 1;
        if (sVar22 < 5) {
          sVar22 = 4;
        }
        iVar13 = BrotliFindAllStaticDictionaryMatches
                           (&params->dictionary,ringbuffer + uVar15,sVar22,uVar37,histogram_cmd);
        auVar48 = _DAT_00132090;
        if (iVar13 != 0) {
          if (0x24 < uVar37) {
            uVar37 = 0x25;
          }
          if (sVar22 <= uVar37) {
            iVar13 = (int)sVar22 << 5;
            do {
              uVar20 = histogram_cmd[sVar22];
              if ((uVar20 < 0xfffffff) &&
                 (uVar15 = (ulong)(uVar20 >> 5) + uVar23 + 1, uVar15 <= (params->dist).max_distance)
                 ) {
                uVar20 = uVar20 & 0x1f;
                *puVar25 = (int)uVar15;
                if (sVar22 == uVar20) {
                  uVar20 = 0;
                }
                puVar25[1] = uVar20 + iVar13;
                puVar25 = puVar25 + 2;
              }
              sVar22 = sVar22 + 1;
              iVar13 = iVar13 + 0x20;
            } while (uVar37 + 1 != sVar22);
          }
        }
        lVar17 = (long)puVar25 - (long)puVar2 >> 3;
        *(int *)((long)local_2780 + lVar40 * 4) = (int)lVar17;
        lVar33 = lVar35;
        lVar26 = lVar40;
        if (puVar25 != puVar2) {
          lVar33 = lVar17 + lVar35;
          uVar20 = *(uint *)((long)local_2790 + lVar33 * 8 + -4);
          if (0x28bf < uVar20) {
            uVar16 = (ulong)(uVar20 >> 5);
            uVar23 = uVar36 + 1;
            uVar15 = uVar36 + uVar16;
            if (lVar39 + position <= uVar15) {
              uVar15 = lVar39 + position;
            }
            uVar37 = uVar15 - 0x3f;
            if (uVar15 < uVar36 + 0x40) {
              uVar37 = uVar23;
            }
            *(undefined8 *)((long)local_2790 + lVar35 * 8) =
                 *(undefined8 *)((long)local_2790 + lVar33 * 8 + -8);
            *(undefined4 *)((long)local_2780 + lVar40 * 4) = 1;
            if ((uVar36 + 0x201 <= uVar37) && (uVar23 < uVar37)) {
              uVar36 = *(ulong *)(hasher + 0x28);
              do {
                uVar21 = uVar23 & ringbuffer_mask;
                uVar30 = (ulong)((uint)(*(int *)(ringbuffer + uVar21) * 0x1e35a7bd) >> 0xf);
                uVar31 = (ulong)*(uint *)(hasher + uVar30 * 4 + 0x30);
                local_27e0 = (uVar36 & uVar23) * 2 + 1;
                local_27f0 = (uVar36 & uVar23) * 2;
                *(int *)(hasher + uVar30 * 4 + 0x30) = (int)uVar23;
                if (uVar23 != uVar31) {
                  lVar33 = 0x40;
                  uVar30 = 0;
                  local_27c8 = 0;
LAB_0010d971:
                  bVar42 = lVar33 != 0;
                  lVar33 = lVar33 + -1;
                  if ((uVar23 - uVar31 <= uVar36 - 0xf) && (bVar42)) {
                    uVar32 = uVar30;
                    if (local_27c8 < uVar30) {
                      uVar32 = local_27c8;
                    }
                    puVar24 = ringbuffer + uVar32 + (uVar31 & ringbuffer_mask);
                    uVar27 = 0x80 - uVar32;
                    if (7 < uVar27) {
                      uVar29 = uVar27 & 0xfffffffffffffff8;
                      lVar26 = 0;
                      uVar38 = 0;
LAB_0010d9de:
                      if (*(ulong *)(puVar24 + uVar38 * 8) ==
                          *(ulong *)(ringbuffer + uVar38 * 8 + uVar32 + uVar21))
                      goto code_r0x0010d9eb;
                      uVar38 = *(ulong *)(ringbuffer + uVar38 * 8 + uVar32 + uVar21) ^
                               *(ulong *)(puVar24 + uVar38 * 8);
                      uVar27 = 0;
                      if (uVar38 != 0) {
                        for (; (uVar38 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                        }
                      }
                      uVar38 = (uVar27 >> 3 & 0x1fffffff) - lVar26;
                      goto LAB_0010da23;
                    }
                    uVar29 = 0;
                    goto LAB_0010dab0;
                  }
                }
LAB_0010d925:
                uVar12 = *(undefined4 *)(hasher + 0x80030);
                *(undefined4 *)(hasher + local_27f0 * 4 + 0x80038) = uVar12;
LAB_0010d937:
                *(undefined4 *)(hasher + local_27e0 * 4 + 0x80038) = uVar12;
                uVar23 = uVar23 + 8;
              } while (uVar23 < uVar37);
            }
            if (uVar37 < uVar15) {
              uVar36 = *(ulong *)(hasher + 0x28);
              do {
                uVar30 = uVar37 & ringbuffer_mask;
                uVar23 = (ulong)((uint)(*(int *)(ringbuffer + uVar30) * 0x1e35a7bd) >> 0xf);
                uVar21 = (ulong)*(uint *)(hasher + uVar23 * 4 + 0x30);
                local_27e0 = (uVar36 & uVar37) * 2 + 1;
                local_27f0 = (uVar36 & uVar37) * 2;
                *(int *)(hasher + uVar23 * 4 + 0x30) = (int)uVar37;
                if (uVar37 != uVar21) {
                  lVar33 = 0x40;
                  uVar23 = 0;
                  local_27c8 = 0;
LAB_0010dbec:
                  bVar42 = lVar33 != 0;
                  lVar33 = lVar33 + -1;
                  if ((uVar37 - uVar21 <= uVar36 - 0xf) && (bVar42)) {
                    uVar31 = uVar23;
                    if (local_27c8 < uVar23) {
                      uVar31 = local_27c8;
                    }
                    puVar24 = ringbuffer + uVar31 + (uVar21 & ringbuffer_mask);
                    uVar32 = 0x80 - uVar31;
                    if (7 < uVar32) {
                      uVar38 = uVar32 & 0xfffffffffffffff8;
                      lVar26 = 0;
                      uVar27 = 0;
LAB_0010dc59:
                      if (*(ulong *)(puVar24 + uVar27 * 8) ==
                          *(ulong *)(ringbuffer + uVar27 * 8 + uVar31 + uVar30))
                      goto code_r0x0010dc66;
                      uVar27 = *(ulong *)(ringbuffer + uVar27 * 8 + uVar31 + uVar30) ^
                               *(ulong *)(puVar24 + uVar27 * 8);
                      uVar32 = 0;
                      if (uVar27 != 0) {
                        for (; (uVar27 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                        }
                      }
                      uVar27 = (uVar32 >> 3 & 0x1fffffff) - lVar26;
                      goto LAB_0010dc94;
                    }
                    uVar38 = 0;
                    goto LAB_0010dd21;
                  }
                }
LAB_0010db9f:
                uVar12 = *(undefined4 *)(hasher + 0x80030);
                *(undefined4 *)(hasher + local_27f0 * 4 + 0x80038) = uVar12;
LAB_0010dbb4:
                *(undefined4 *)(hasher + local_27e0 * 4 + 0x80038) = uVar12;
                uVar37 = uVar37 + 1;
              } while (uVar37 < uVar15);
            }
            lVar26 = uVar16 - 1;
            memset((void *)((long)local_2780 + lVar40 * 4 + 4),0,lVar26 * 4);
            lVar33 = lVar35 + 1;
            lVar26 = lVar40 + lVar26;
            auVar48 = _DAT_00132090;
          }
        }
        lVar40 = lVar26 + 1;
        lVar35 = lVar33;
      } while (lVar26 + 4U < num_bytes);
    }
    else {
      bVar41 = false;
    }
  }
  sVar22 = *num_literals;
  sVar6 = *last_insert_len;
  uVar8 = *(undefined8 *)dist_cache;
  uVar9 = *(undefined8 *)(dist_cache + 2);
  sVar7 = *num_commands;
  lVar39 = num_bytes + 1;
  if (lVar39 == 0) {
    queue = (StartPosQueue *)0x0;
  }
  else {
    queue = (StartPosQueue *)BrotliAllocate(m,lVar39 * 0x10);
  }
  InitZopfliCostModel(m,&model,&params->dist,num_bytes);
  pfVar1 = (float *)(queue->q_[0].distance_cache + 1);
  bVar42 = true;
  lVar40 = lVar39;
  pfVar11 = pfVar1;
  do {
    for (; lVar40 != 0; lVar40 = lVar40 + -1) {
      ((PosData *)(pfVar11 + -3))->pos = 1;
      (pfVar11 + -1)[0] = 0.0;
      (pfVar11 + -1)[1] = 1.7e+38;
      pfVar11 = pfVar11 + 4;
    }
    if (bVar42) {
      nodes = (ZopfliNode *)0x10df3c;
      ZopfliCostModelSetFromLiteralCosts(&model,position,ringbuffer,ringbuffer_mask);
    }
    else {
      sVar19 = *num_commands;
      memset(histogram_literal,0,0x400);
      memset(histogram_cmd,0,0xb00);
      memset(histogram_dist,0,0x880);
      if (sVar19 != sVar7) {
        lVar40 = 0;
        uVar36 = position - sVar6;
        do {
          uVar16 = (ulong)commands[lVar40].insert_len_;
          uVar20 = commands[lVar40].copy_len_;
          uVar4 = commands[lVar40].dist_prefix_;
          uVar5 = commands[lVar40].cmd_prefix_;
          histogram_cmd[uVar5] = histogram_cmd[uVar5] + 1;
          uVar23 = uVar36;
          uVar15 = uVar16;
          if (0x7f < uVar5) {
            histogram_dist[uVar4 & 0x3ff] = histogram_dist[uVar4 & 0x3ff] + 1;
          }
          for (; uVar15 != 0; uVar15 = uVar15 - 1) {
            histogram_literal[ringbuffer[uVar23 & ringbuffer_mask]] =
                 histogram_literal[ringbuffer[uVar23 & ringbuffer_mask]] + 1;
            uVar23 = uVar23 + 1;
          }
          uVar36 = uVar36 + uVar16 + (ulong)(uVar20 & 0x1ffffff);
          lVar40 = lVar40 + 1;
        } while (lVar40 != sVar19 - sVar7);
      }
      SetCost(histogram_literal,0x100,1,cost_literal);
      SetCost(histogram_cmd,0x2c0,0,model.cost_cmd_);
      nodes = (ZopfliNode *)0x10e071;
      SetCost(histogram_dist,(ulong)model.distance_histogram_size,0,model.cost_dist_);
      model.min_cost_cmd_ = 1.7e+38;
      lVar40 = 0;
      do {
        if (model.cost_cmd_[lVar40] <= model.min_cost_cmd_) {
          model.min_cost_cmd_ = model.cost_cmd_[lVar40];
        }
        lVar40 = lVar40 + 1;
      } while (lVar40 != 0x2c0);
      *model.literal_costs_ = 0.0;
      if (model.num_bytes_ != 0) {
        fVar43 = 0.0;
        sVar19 = 0;
        fVar46 = 0.0;
        do {
          fVar3 = cost_literal[ringbuffer[position + sVar19 & ringbuffer_mask]];
          fVar47 = fVar46 + fVar43 + fVar3;
          model.literal_costs_[sVar19 + 1] = fVar47;
          sVar19 = sVar19 + 1;
          fVar43 = (fVar43 + fVar3) - (fVar47 - fVar46);
          fVar46 = fVar47;
        } while (model.num_bytes_ != sVar19);
      }
    }
    *num_commands = sVar7;
    *num_literals = sVar22;
    *last_insert_len = sVar6;
    *(undefined8 *)dist_cache = uVar8;
    *(undefined8 *)(dist_cache + 2) = uVar9;
    uVar20 = 0x145;
    if (params->quality < 0xb) {
      uVar20 = 0x96;
    }
    *(undefined4 *)&queue->q_[0].pos = 0;
    queue->q_[0].distance_cache[1] = 0;
    histogram_cmd[0x40] = 0;
    histogram_cmd[0x41] = 0;
    if (bVar41) {
      lVar40 = 0;
      sVar19 = 0;
      do {
        sVar18 = UpdateNodes(num_bytes,position,sVar19,ringbuffer,ringbuffer_mask,params,
                             max_backward_limit,dist_cache,
                             (ulong)*(uint *)((long)local_2780 + sVar19 * 4),
                             (BackwardMatch *)(lVar40 * 8 + (long)local_2790),&model,
                             (StartPosQueue *)histogram_cmd,(ZopfliNode *)queue);
        uVar36 = 0;
        if (0x3fff < sVar18) {
          uVar36 = sVar18;
        }
        uVar23 = (ulong)*(uint *)((long)local_2780 + sVar19 * 4);
        lVar40 = lVar40 + uVar23;
        if (((uVar23 == 1) &&
            (uVar14 = *(uint *)((long)local_2790 + lVar40 * 8 + -4) >> 5, uVar20 < uVar14)) &&
           (uVar36 < uVar14)) {
          uVar36 = (ulong)uVar14;
        }
        if (1 < uVar36) {
          lVar35 = uVar36 - 1;
          uVar36 = sVar19 + 4;
          do {
            sVar19 = uVar36 - 3;
            if (num_bytes <= uVar36) break;
            EvaluateNode(position,sVar19,max_backward_limit,(size_t)dist_cache,(int *)&model,
                         (ZopfliCostModel *)histogram_cmd,queue,nodes);
            lVar40 = lVar40 + (ulong)*(uint *)((long)local_2780 + uVar36 * 4 + -0xc);
            uVar36 = uVar36 + 1;
            lVar35 = lVar35 + -1;
          } while (lVar35 != 0);
        }
        uVar36 = sVar19 + 4;
        sVar19 = sVar19 + 1;
      } while (uVar36 < num_bytes);
    }
    sVar19 = ComputeShortestPathFromNodes(num_bytes,(ZopfliNode *)queue);
    *num_commands = *num_commands + sVar19;
    BrotliZopfliCreateCommands
              (num_bytes,position,max_backward_limit,(ZopfliNode *)queue,dist_cache,last_insert_len,
               params,commands,num_literals);
    bVar10 = !bVar42;
    bVar42 = false;
    lVar40 = lVar39;
    pfVar11 = pfVar1;
    if (bVar10) {
      BrotliFree(m,model.literal_costs_);
      model.literal_costs_ = (float *)0x0;
      BrotliFree(m,model.cost_dist_);
      model.cost_dist_ = (float *)0x0;
      BrotliFree(m,queue);
      BrotliFree(m,local_2790);
      BrotliFree(m,local_2780);
      return;
    }
  } while( true );
code_r0x0010d2b1:
  uVar27 = uVar27 + 1;
  lVar33 = lVar33 + -8;
  puVar34 = puVar24 + (uVar37 & 0xfffffffffffffff8);
  uVar38 = uVar37 & 0xfffffffffffffff8;
  if (uVar37 >> 3 == uVar27) goto LAB_0010d31d;
  goto LAB_0010d2a4;
code_r0x0010d481:
  uVar29 = uVar29 + 1;
  lVar26 = lVar26 + -8;
  if (uVar27 >> 3 == uVar29) goto code_r0x0010d48d;
  goto LAB_0010d474;
code_r0x0010d48d:
  puVar24 = puVar24 + -lVar26;
LAB_0010d5a8:
  uVar27 = uVar27 & 7;
  uVar29 = uVar38;
  if (uVar27 != 0) {
    uVar28 = uVar38 | uVar27;
    do {
      uVar29 = uVar38;
      if (ringbuffer[uVar38 + uVar32 + uVar15] != *puVar24) break;
      puVar24 = puVar24 + 1;
      uVar38 = uVar38 + 1;
      uVar27 = uVar27 - 1;
      uVar29 = uVar28;
    } while (uVar27 != 0);
  }
LAB_0010d4bc:
  uVar29 = uVar29 + uVar32;
  if (puVar25 == (undefined4 *)0x0) {
    puVar25 = (undefined4 *)0x0;
  }
  else if (uVar21 < uVar29) {
    *puVar25 = (int)(uVar36 - uVar31);
    puVar25[1] = (int)uVar29 << 5;
    puVar25 = puVar25 + 2;
    uVar21 = uVar29;
  }
  if (uVar16 <= uVar29) {
    if (uVar37 < 0x80) goto LAB_0010d642;
    *(undefined4 *)(hasher + local_2750 * 4 + 0x80038) =
         *(undefined4 *)(hasher + (uVar31 & uVar30) * 8 + 0x80038);
    uVar12 = *(undefined4 *)(hasher + (uVar31 & uVar30) * 8 + 0x8003c);
    goto LAB_0010d5fb;
  }
  if (ringbuffer[uVar29 + (uVar31 & ringbuffer_mask)] < ringbuffer[uVar29 + uVar15]) {
    if (0x7f < uVar37) {
      *(int *)(hasher + local_2750 * 4 + 0x80038) = (int)uVar31;
    }
    lVar26 = (uVar31 & uVar30) * 2 + 1;
    local_27c0 = uVar29;
    local_2750 = lVar26;
  }
  else {
    if (0x7f < uVar37) {
      *(int *)(hasher + local_2740 * 4 + 0x80038) = (int)uVar31;
    }
    lVar26 = (uVar31 & uVar30) * 2;
    local_2798 = uVar29;
    local_2740 = lVar26;
  }
  uVar31 = (ulong)*(uint *)(hasher + lVar26 * 4 + 0x80038);
  if (uVar36 == uVar31) goto LAB_0010d5dd;
  goto LAB_0010d402;
code_r0x0010d9eb:
  uVar38 = uVar38 + 1;
  lVar26 = lVar26 + -8;
  if (uVar27 >> 3 == uVar38) goto code_r0x0010d9f7;
  goto LAB_0010d9de;
code_r0x0010d9f7:
  puVar24 = puVar24 + -lVar26;
LAB_0010dab0:
  uVar27 = uVar27 & 7;
  uVar38 = uVar29;
  if (uVar27 != 0) {
    uVar28 = uVar29 | uVar27;
    do {
      uVar38 = uVar29;
      if (ringbuffer[uVar29 + uVar32 + uVar21] != *puVar24) break;
      puVar24 = puVar24 + 1;
      uVar29 = uVar29 + 1;
      uVar27 = uVar27 - 1;
      uVar38 = uVar28;
    } while (uVar27 != 0);
  }
LAB_0010da23:
  uVar38 = uVar38 + uVar32;
  if (0x7f < uVar38) {
    *(undefined4 *)(hasher + local_27f0 * 4 + 0x80038) =
         *(undefined4 *)(hasher + (uVar31 & uVar36) * 8 + 0x80038);
    uVar12 = *(undefined4 *)(hasher + (uVar31 & uVar36) * 8 + 0x8003c);
    goto LAB_0010d937;
  }
  uVar32 = (uVar31 & uVar36) * 2;
  if (ringbuffer[uVar38 + (uVar31 & ringbuffer_mask)] < ringbuffer[uVar38 + uVar21]) {
    *(int *)(hasher + local_27f0 * 4 + 0x80038) = (int)uVar31;
    uVar32 = uVar32 | 1;
    local_27f0 = uVar32;
    local_27c8 = uVar38;
  }
  else {
    *(int *)(hasher + local_27e0 * 4 + 0x80038) = (int)uVar31;
    uVar30 = uVar38;
    local_27e0 = uVar32;
  }
  uVar31 = (ulong)*(uint *)(hasher + uVar32 * 4 + 0x80038);
  if (uVar23 == uVar31) goto LAB_0010d925;
  goto LAB_0010d971;
code_r0x0010dc66:
  uVar27 = uVar27 + 1;
  lVar26 = lVar26 + -8;
  if (uVar32 >> 3 == uVar27) goto code_r0x0010dc72;
  goto LAB_0010dc59;
code_r0x0010dc72:
  puVar24 = puVar24 + -lVar26;
LAB_0010dd21:
  uVar32 = uVar32 & 7;
  uVar27 = uVar38;
  if (uVar32 != 0) {
    uVar29 = uVar38 | uVar32;
    do {
      uVar27 = uVar38;
      if (ringbuffer[uVar38 + uVar31 + uVar30] != *puVar24) break;
      puVar24 = puVar24 + 1;
      uVar38 = uVar38 + 1;
      uVar32 = uVar32 - 1;
      uVar27 = uVar29;
    } while (uVar32 != 0);
  }
LAB_0010dc94:
  uVar27 = uVar27 + uVar31;
  if (0x7f < uVar27) {
    *(undefined4 *)(hasher + local_27f0 * 4 + 0x80038) =
         *(undefined4 *)(hasher + (uVar21 & uVar36) * 8 + 0x80038);
    uVar12 = *(undefined4 *)(hasher + (uVar21 & uVar36) * 8 + 0x8003c);
    goto LAB_0010dbb4;
  }
  uVar31 = (uVar21 & uVar36) * 2;
  if (ringbuffer[uVar27 + (uVar21 & ringbuffer_mask)] < ringbuffer[uVar27 + uVar30]) {
    *(int *)(hasher + local_27f0 * 4 + 0x80038) = (int)uVar21;
    uVar31 = uVar31 | 1;
    local_27f0 = uVar31;
    local_27c8 = uVar27;
  }
  else {
    *(int *)(hasher + local_27e0 * 4 + 0x80038) = (int)uVar21;
    uVar23 = uVar27;
    local_27e0 = uVar31;
  }
  uVar21 = (ulong)*(uint *)(hasher + uVar31 * 4 + 0x80038);
  if (uVar37 == uVar21) goto LAB_0010db9f;
  goto LAB_0010dbec;
}

Assistant:

void BrotliCreateHqZopfliBackwardReferences(MemoryManager* m,
    size_t num_bytes, size_t position, const uint8_t* ringbuffer,
    size_t ringbuffer_mask, const BrotliEncoderParams* params,
    HasherHandle hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  uint32_t* num_matches = BROTLI_ALLOC(m, uint32_t, num_bytes);
  size_t matches_size = 4 * num_bytes;
  const size_t store_end = num_bytes >= StoreLookaheadH10() ?
      position + num_bytes - StoreLookaheadH10() + 1 : position;
  size_t cur_match_pos = 0;
  size_t i;
  size_t orig_num_literals;
  size_t orig_last_insert_len;
  int orig_dist_cache[4];
  size_t orig_num_commands;
  ZopfliCostModel model;
  ZopfliNode* nodes;
  BackwardMatch* matches = BROTLI_ALLOC(m, BackwardMatch, matches_size);
  size_t gap = 0;
  size_t shadow_matches = 0;
  if (BROTLI_IS_OOM(m)) return;
  for (i = 0; i + HashTypeLengthH10() - 1 < num_bytes; ++i) {
    const size_t pos = position + i;
    size_t max_distance = BROTLI_MIN(size_t, pos, max_backward_limit);
    size_t max_length = num_bytes - i;
    size_t num_found_matches;
    size_t cur_match_end;
    size_t j;
    /* Ensure that we have enough free slots. */
    BROTLI_ENSURE_CAPACITY(m, BackwardMatch, matches, matches_size,
        cur_match_pos + MAX_NUM_MATCHES_H10 + shadow_matches);
    if (BROTLI_IS_OOM(m)) return;
    num_found_matches = FindAllMatchesH10(hasher,
        &params->dictionary, ringbuffer, ringbuffer_mask, pos, max_length,
        max_distance, gap, params, &matches[cur_match_pos + shadow_matches]);
    cur_match_end = cur_match_pos + num_found_matches;
    for (j = cur_match_pos; j + 1 < cur_match_end; ++j) {
      BROTLI_DCHECK(BackwardMatchLength(&matches[j]) <=
          BackwardMatchLength(&matches[j + 1]));
    }
    num_matches[i] = (uint32_t)num_found_matches;
    if (num_found_matches > 0) {
      const size_t match_len = BackwardMatchLength(&matches[cur_match_end - 1]);
      if (match_len > MAX_ZOPFLI_LEN_QUALITY_11) {
        const size_t skip = match_len - 1;
        matches[cur_match_pos++] = matches[cur_match_end - 1];
        num_matches[i] = 1;
        /* Add the tail of the copy to the hasher. */
        StoreRangeH10(hasher, ringbuffer, ringbuffer_mask, pos + 1,
                      BROTLI_MIN(size_t, pos + match_len, store_end));
        memset(&num_matches[i + 1], 0, skip * sizeof(num_matches[0]));
        i += skip;
      } else {
        cur_match_pos = cur_match_end;
      }
    }
  }
  orig_num_literals = *num_literals;
  orig_last_insert_len = *last_insert_len;
  memcpy(orig_dist_cache, dist_cache, 4 * sizeof(dist_cache[0]));
  orig_num_commands = *num_commands;
  nodes = BROTLI_ALLOC(m, ZopfliNode, num_bytes + 1);
  if (BROTLI_IS_OOM(m)) return;
  InitZopfliCostModel(m, &model, &params->dist, num_bytes);
  if (BROTLI_IS_OOM(m)) return;
  for (i = 0; i < 2; i++) {
    BrotliInitZopfliNodes(nodes, num_bytes + 1);
    if (i == 0) {
      ZopfliCostModelSetFromLiteralCosts(
          &model, position, ringbuffer, ringbuffer_mask);
    } else {
      ZopfliCostModelSetFromCommands(&model, position, ringbuffer,
          ringbuffer_mask, commands, *num_commands - orig_num_commands,
          orig_last_insert_len);
    }
    *num_commands = orig_num_commands;
    *num_literals = orig_num_literals;
    *last_insert_len = orig_last_insert_len;
    memcpy(dist_cache, orig_dist_cache, 4 * sizeof(dist_cache[0]));
    *num_commands += ZopfliIterate(num_bytes, position, ringbuffer,
        ringbuffer_mask, params, max_backward_limit, gap, dist_cache,
        &model, num_matches, matches, nodes);
    BrotliZopfliCreateCommands(num_bytes, position, max_backward_limit,
        nodes, dist_cache, last_insert_len, params, commands, num_literals);
  }
  CleanupZopfliCostModel(m, &model);
  BROTLI_FREE(m, nodes);
  BROTLI_FREE(m, matches);
  BROTLI_FREE(m, num_matches);
}